

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_reduce_root_p_tree_multiple
          (bsc_step_t depends,bsp_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
          bsc_size_t n)

{
  double dVar1;
  int local_54;
  bsc_step_t local_50;
  int local_4c;
  bsc_step_t finished;
  bsc_size_t i;
  bsc_pid_t root_P;
  bsc_pid_t P;
  group_t *g;
  bsc_size_t n_local;
  bsc_coll_params_t *params_local;
  bsc_group_t group_local;
  bsp_pid_t root_local;
  bsc_step_t depends_local;
  
  if (group == (bsc_group_t)0x0) {
    local_54 = bsp_nprocs();
  }
  else {
    local_54 = *group;
  }
  dVar1 = sqrt((double)local_54);
  dVar1 = ceil(dVar1);
  local_50 = depends;
  for (local_4c = 0; local_4c < n; local_4c = local_4c + 1) {
    local_50 = bsc_reduce_qtree_single
                         (depends,root,group,params[local_4c].src,params[local_4c].dst,
                          params[local_4c].tmp,params[local_4c].reducer,params[local_4c].zero,
                          params[local_4c].nmemb,params[local_4c].size,(int)dVar1);
  }
  return local_50;
}

Assistant:

bsc_step_t bsc_reduce_root_p_tree_multiple( bsc_step_t depends,
                      bsp_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n)
{
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs(), root_P = (bsc_pid_t) ceil(sqrt(P));
    bsc_size_t i;
    bsc_step_t finished = depends;
    for ( i = 0; i < n ; ++i ) {
        finished = bsc_reduce_qtree_single( depends, root, group,
                   params[i].src, params[i].dst, params[i].tmp,
                   params[i].reducer, params[i].zero, 
                   params[i].nmemb, params[i].size, root_P );
    }

    return finished;
}